

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::RevealD::forward(RevealD *this)

{
  bool bVar1;
  Op *in_RDI;
  
  Op::reinit(in_RDI);
  if (in_RDI->forwardRound == 1) {
    (**(code **)*in_RDI[2]._vptr_Op)();
    (**(code **)**(undefined8 **)&in_RDI[1].localRound)();
    bVar1 = Op::forwardHasNext(*(Op **)&in_RDI[1].localRound);
    if ((bVar1) || (bVar1 = Op::forwardHasNext((Op *)in_RDI[2]._vptr_Op), bVar1)) {
      in_RDI->forwardRound = in_RDI->forwardRound + -1;
    }
  }
  return;
}

Assistant:

void MathOp::RevealD::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            pDegRed->forward();
            pReveal->forward();
            if (pReveal->forwardHasNext() || pDegRed->forwardHasNext()) {
                forwardRound--;
            }
//            pReveal->forward();
//            if (pReveal->forwardHasNext()) {
//                forwardRound--;
//            }
            break;
    }
}